

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::scrollTo(QListView *this,QModelIndex *index,ScrollHint hint)

{
  long lVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  QListViewPrivate *this_00;
  int in_EDX;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QListViewPrivate *d;
  QRect rect;
  QPersistentModelIndex *in_stack_ffffffffffffff78;
  QModelIndex *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar7;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar8;
  ScrollHint SVar9;
  QModelIndex *rect_00;
  QRect in_stack_ffffffffffffffc0;
  undefined1 local_30 [4];
  QRect *rect_01;
  QModelIndex *in_stack_ffffffffffffffe0;
  QListViewPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rect_00 = in_RDI;
  this_00 = d_func((QListView *)0x877249);
  QModelIndex::parent(in_RDI);
  bVar4 = ::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  uVar8 = true;
  if (!bVar4) {
    iVar5 = QModelIndex::column(in_RSI);
    uVar8 = iVar5 != this_00->column;
  }
  if ((bool)uVar8 == false) {
    _local_30 = &DAT_aaaaaaaaaaaaaaaa;
    auVar6 = (**(code **)(*(long *)in_RDI + 0x1e0))(in_RDI,in_RSI);
    rect_01 = auVar6._8_8_;
    _local_30 = auVar6._0_8_;
    iVar5 = (int)((ulong)in_RDI >> 0x20);
    SVar9 = (ScrollHint)((ulong)in_RSI >> 0x20);
    bVar4 = QRect::isValid((QRect *)in_stack_ffffffffffffff80);
    if (bVar4) {
      bVar7 = 0;
      if (in_EDX == 0) {
        in_stack_ffffffffffffffc0 =
             QWidget::rect((QWidget *)CONCAT17(uVar8,in_stack_ffffffffffffff98));
        bVar7 = QRect::contains((QRect *)&stack0xffffffffffffffc0,SUB81(local_30,0));
      }
      if ((bVar7 & 1) == 0) {
        if ((this_00->flow == TopToBottom) || (bVar4 = QListViewPrivate::isWrapping(this_00), bVar4)
           ) {
          in_stack_ffffffffffffff80 =
               (QModelIndex *)
               QAbstractScrollArea::verticalScrollBar
                         ((QAbstractScrollArea *)in_stack_ffffffffffffff80);
          QListViewPrivate::verticalScrollToValue
                    (in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0._0_8_,
                     (QRect *)rect_00,SVar9);
          QAbstractSlider::setValue
                    ((QAbstractSlider *)CONCAT17(uVar8,in_stack_ffffffffffffff98),iVar5);
        }
        if ((this_00->flow == LeftToRight) || (bVar4 = QListViewPrivate::isWrapping(this_00), bVar4)
           ) {
          QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff80)
          ;
          uVar3 = _local_30;
          uVar2 = (ulong)_local_30 >> 0x20;
          SVar9 = (ScrollHint)uVar2;
          _local_30 = (undefined1 *)uVar3;
          QListViewPrivate::horizontalScrollToValue
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,rect_01,SVar9);
          QAbstractSlider::setValue
                    ((QAbstractSlider *)CONCAT17(uVar8,in_stack_ffffffffffffff98),iVar5);
        }
      }
      else {
        QWidget::update((QWidget *)CONCAT17(bVar7,in_stack_ffffffffffffff88),
                        (QRect *)in_stack_ffffffffffffff80);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QListView);

    if (index.parent() != d->root || index.column() != d->column)
        return;

    const QRect rect = visualRect(index);
    if (!rect.isValid())
        return;
    if (hint == EnsureVisible && d->viewport->rect().contains(rect)) {
        d->viewport->update(rect);
        return;
    }

    if (d->flow == QListView::TopToBottom || d->isWrapping()) // vertical
        verticalScrollBar()->setValue(d->verticalScrollToValue(index, rect, hint));

    if (d->flow == QListView::LeftToRight || d->isWrapping()) // horizontal
        horizontalScrollBar()->setValue(d->horizontalScrollToValue(index, rect, hint));
}